

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O0

uchar * rans_uncompress_O1(uchar *in,uint in_size,uint *out_size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  byte *pbVar6;
  RansState RVar7;
  uint32_t uVar8;
  anon_struct_8_2_94730ba2 aVar9;
  uchar c3;
  uint8_t c [4];
  uint32_t m [4];
  RansState R [4];
  int i4 [4];
  uint uStack_c0880;
  int l3;
  int l2;
  int l1;
  int l0;
  int isz4;
  uint8_t *ptr;
  RansState rans3;
  RansState rans2;
  RansState rans1;
  RansState rans0;
  RansDecSymbol syms [256] [256];
  ari_decoder D [256];
  char *out_buf;
  uint local_48;
  int rle_j;
  int rle_i;
  int in_sz;
  int out_sz;
  int x;
  int j;
  int i;
  uchar *cp;
  uint *out_size_local;
  uint in_size_local;
  uchar *in_local;
  
  memset(syms[0xff] + 0xfe,0,0x80800);
  if (*in == '\x01') {
    uVar5 = *(uint *)(in + 5);
    if (*(int *)(in + 1) == in_size - 9) {
      in_local = (uchar *)malloc((long)(int)uVar5);
      if (in_local == (uchar *)0x0) {
        in_local = (uchar *)0x0;
      }
      else {
        local_48 = 0;
        _j = in + 10;
        x = (int)in[9];
        do {
          in_sz = 0;
          out_buf._4_4_ = 0;
          out_sz = (int)*_j;
          _j = _j + 1;
          do {
            bVar1 = *_j;
            D[x].fc[(long)out_sz + -1].F = (uint)bVar1;
            pbVar6 = _j + 1;
            if (0x7f < bVar1) {
              D[x].fc[(long)out_sz + -1].F = D[x].fc[(long)out_sz + -1].F & 0xffffff7f;
              D[x].fc[(long)out_sz + -1].F =
                   (D[x].fc[(long)out_sz + -1].F & 0x7fU) << 8 | (uint)_j[1];
              pbVar6 = _j + 2;
            }
            _j = pbVar6;
            D[x].fc[(long)out_sz + -1].C = in_sz;
            if (D[x].fc[(long)out_sz + -1].F == 0) {
              D[x].fc[(long)out_sz + -1].F = 0x1000;
            }
            RansDecSymbolInit((RansDecSymbol *)(&rans1 + (long)x * 0x100 + (long)out_sz),
                              D[x].fc[(long)out_sz + -1].C,D[x].fc[(long)out_sz + -1].F);
            if (D[x].fc[0xff] == (anon_struct_8_2_94730ba2)0x0) {
              aVar9 = (anon_struct_8_2_94730ba2)malloc(0x1000);
              D[x].fc[0xff] = aVar9;
            }
            memset((void *)((long)D[x].fc[0xff] + (long)in_sz),out_sz & 0xff,
                   (long)D[x].fc[(long)out_sz + -1].F);
            in_sz = D[x].fc[(long)out_sz + -1].F + in_sz;
            if (0x1000 < in_sz) {
              __assert_fail("x <= TOTFREQ",
                            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                            ,0x25c,
                            "unsigned char *rans_uncompress_O1(unsigned char *, unsigned int, unsigned int *)"
                           );
            }
            if ((out_buf._4_4_ == 0) && (out_sz + 1U == (uint)*_j)) {
              out_sz = (int)*_j;
              out_buf._4_4_ = (uint)_j[1];
              _j = _j + 2;
            }
            else if (out_buf._4_4_ == 0) {
              out_sz = (int)*_j;
              _j = _j + 1;
            }
            else {
              out_buf._4_4_ = out_buf._4_4_ - 1;
              out_sz = out_sz + 1;
            }
          } while (out_sz != 0);
          if ((local_48 == 0) && (x + 1U == (uint)*_j)) {
            x = (int)*_j;
            local_48 = (uint)_j[1];
            _j = _j + 2;
          }
          else if (local_48 == 0) {
            x = (int)*_j;
            _j = _j + 1;
          }
          else {
            local_48 = local_48 - 1;
            x = x + 1;
          }
        } while (x != 0);
        _l0 = _j;
        RansDecInit(&rans2,(uint8_t **)&l0);
        RansDecInit(&rans3,(uint8_t **)&l0);
        RansDecInit((RansState *)((long)&ptr + 4),(uint8_t **)&l0);
        RansDecInit((RansState *)&ptr,(uint8_t **)&l0);
        RVar7 = (int)uVar5 >> 2;
        l2 = 0;
        l3 = 0;
        uStack_c0880 = 0;
        i4[3] = 0;
        i4[0] = RVar7 << 1;
        i4[1] = RVar7 * 3;
        m[2] = rans2;
        m[3] = rans3;
        R[0] = ptr._4_4_;
        R[1] = (RansState)ptr;
        R[3] = RVar7;
        for (R[2] = 0; (int)R[2] < (int)RVar7; R[2] = R[2] + 1) {
          m[0] = R[0] & 0xfff;
          m[1] = R[1] & 0xfff;
          bVar1 = *(byte *)((long)D[l2].fc[0xff] + (ulong)(m[2] & 0xfff));
          bVar2 = *(byte *)((long)D[l3].fc[0xff] + (ulong)(m[3] & 0xfff));
          bVar3 = *(byte *)((long)D[(int)uStack_c0880].fc[0xff] + (ulong)m[0]);
          bVar4 = *(byte *)((long)D[i4[3]].fc[0xff] + (ulong)m[1]);
          in_local[(int)R[2]] = bVar1;
          in_local[(int)R[3]] = bVar2;
          in_local[i4[0]] = bVar3;
          in_local[i4[1]] = bVar4;
          m[2] = ((m[2] & 0xfff) - (uint)(ushort)(&rans1)[(long)l2 * 0x100 + (ulong)bVar1]) +
                 (uint)*(ushort *)((long)&rans1 + (ulong)bVar1 * 4 + (long)l2 * 0x400 + 2) *
                 (m[2] >> 0xc);
          m[3] = ((m[3] & 0xfff) - (uint)(ushort)(&rans1)[(long)l3 * 0x100 + (ulong)bVar2]) +
                 (uint)*(ushort *)((long)&rans1 + (ulong)bVar2 * 4 + (long)l3 * 0x400 + 2) *
                 (m[3] >> 0xc);
          R[0] = (m[0] - (ushort)(&rans1)[(long)(int)uStack_c0880 * 0x100 + (ulong)bVar3]) +
                 (uint)*(ushort *)
                        ((long)&rans1 + (ulong)bVar3 * 4 + (long)(int)uStack_c0880 * 0x400 + 2) *
                 (R[0] >> 0xc);
          R[1] = (m[1] - (ushort)(&rans1)[(long)i4[3] * 0x100 + (ulong)bVar4]) +
                 (uint)*(ushort *)((long)&rans1 + (ulong)bVar4 * 4 + (long)i4[3] * 0x400 + 2) *
                 (R[1] >> 0xc);
          RansDecRenorm(m + 2,(uint8_t **)&l0);
          RansDecRenorm(m + 3,(uint8_t **)&l0);
          RansDecRenorm(R,(uint8_t **)&l0);
          RansDecRenorm(R + 1,(uint8_t **)&l0);
          l2 = (int)bVar1;
          l3 = (int)bVar2;
          uStack_c0880 = (uint)bVar3;
          i4[3] = (int)bVar4;
          R[3] = R[3] + 1;
          i4[0] = i4[0] + 1;
          i4[1] = i4[1] + 1;
        }
        rans2 = m[2];
        rans3 = m[3];
        ptr._4_4_ = R[0];
        ptr._0_4_ = R[1];
        for (; i4[1] < (int)uVar5; i4[1] = i4[1] + 1) {
          aVar9 = D[i4[3]].fc[0xff];
          uVar8 = RansDecGet((RansState *)&ptr,0xc);
          bVar1 = *(byte *)((long)aVar9 + (ulong)uVar8);
          in_local[i4[1]] = bVar1;
          RansDecAdvanceSymbol
                    ((RansState *)&ptr,(uint8_t **)&l0,
                     (RansDecSymbol *)(&rans1 + (long)i4[3] * 0x100 + (ulong)bVar1),0xc);
          i4[3] = (int)bVar1;
        }
        *out_size = uVar5;
        for (x = 0; x < 0x100; x = x + 1) {
          if (D[x].fc[0xff] != (anon_struct_8_2_94730ba2)0x0) {
            free((void *)D[x].fc[0xff]);
          }
        }
      }
    }
    else {
      in_local = (uchar *)0x0;
    }
  }
  else {
    in_local = (uchar *)0x0;
  }
  return in_local;
}

Assistant:

unsigned char *rans_uncompress_O1(unsigned char *in, unsigned int in_size,
				  unsigned int *out_size) {
    /* Load in the static tables */
    unsigned char *cp = in + 9;
    int i, j = -999, x, out_sz, in_sz, rle_i, rle_j;
    char *out_buf;
    ari_decoder D[256];
    RansDecSymbol syms[256][256];

    memset(D, 0, 256*sizeof(*D));

    if (*in++ != 1) // Order-1 check
	return NULL;

    in_sz  = ((in[0])<<0) | ((in[1])<<8) | ((in[2])<<16) | ((in[3])<<24);
    out_sz = ((in[4])<<0) | ((in[5])<<8) | ((in[6])<<16) | ((in[7])<<24);
    if (in_sz != in_size-9)
	return NULL;

    out_buf = malloc(out_sz);
    if (!out_buf)
	return NULL;

    //fprintf(stderr, "out_sz=%d\n", out_sz);

    //i = *cp++;
    rle_i = 0;
    i = *cp++;
    do {
	rle_j = x = 0;
	j = *cp++;
	do {
	    if ((D[i].fc[j].F = *cp++) >= 128) {
		D[i].fc[j].F &= ~128;
		D[i].fc[j].F = ((D[i].fc[j].F & 127) << 8) | *cp++;
	    }
	    D[i].fc[j].C = x;

	    //fprintf(stderr, "i=%d j=%d F=%d C=%d\n", i, j, D[i].fc[j].F, D[i].fc[j].C);

	    if (!D[i].fc[j].F)
		D[i].fc[j].F = TOTFREQ;

	    RansDecSymbolInit(&syms[i][j], D[i].fc[j].C, D[i].fc[j].F);

	    /* Build reverse lookup table */
	    if (!D[i].R) D[i].R = (unsigned char *)malloc(TOTFREQ);
	    memset(&D[i].R[x], j, D[i].fc[j].F);

	    x += D[i].fc[j].F;
	    assert(x <= TOTFREQ);

	    if (!rle_j && j+1 == *cp) {
		j = *cp++;
		rle_j = *cp++;
	    } else if (rle_j) {
		rle_j--;
		j++;
	    } else {
		j = *cp++;
	    }
	} while(j);

	if (!rle_i && i+1 == *cp) {
	    i = *cp++;
	    rle_i = *cp++;
	} else if (rle_i) {
	    rle_i--;
	    i++;
	} else {
	    i = *cp++;
	}
    } while (i);

    // Precompute reverse lookup of frequency.

    RansState rans0, rans1, rans2, rans3;
    uint8_t *ptr = cp;
    RansDecInit(&rans0, &ptr);
    RansDecInit(&rans1, &ptr);
    RansDecInit(&rans2, &ptr);
    RansDecInit(&rans3, &ptr);

    int isz4 = out_sz>>2;
    int l0 = 0;
    int l1 = 0;
    int l2 = 0;
    int l3 = 0;
    int i4[] = {0*isz4, 1*isz4, 2*isz4, 3*isz4};

    RansState R[4];
    R[0] = rans0;
    R[1] = rans1;
    R[2] = rans2;
    R[3] = rans3;

    for (; i4[0] < isz4; i4[0]++, i4[1]++, i4[2]++, i4[3]++) {
	uint32_t m[4] = {R[0] & ((1u << TF_SHIFT)-1),
			 R[1] & ((1u << TF_SHIFT)-1),
			 R[2] & ((1u << TF_SHIFT)-1),
			 R[3] & ((1u << TF_SHIFT)-1)};

	uint8_t c[4] = {D[l0].R[m[0]],
			D[l1].R[m[1]],
			D[l2].R[m[2]],
			D[l3].R[m[3]]};

	out_buf[i4[0]] = c[0];
	out_buf[i4[1]] = c[1];
	out_buf[i4[2]] = c[2];
	out_buf[i4[3]] = c[3];

	//RansDecAdvanceSymbolStep(&R[0], &syms[l0][c[0]], TF_SHIFT);
	//RansDecAdvanceSymbolStep(&R[1], &syms[l1][c[1]], TF_SHIFT);
	//RansDecAdvanceSymbolStep(&R[2], &syms[l2][c[2]], TF_SHIFT);
	//RansDecAdvanceSymbolStep(&R[3], &syms[l3][c[3]], TF_SHIFT);

	R[0] = syms[l0][c[0]].freq * (R[0]>>TF_SHIFT);
	R[1] = syms[l1][c[1]].freq * (R[1]>>TF_SHIFT);
	R[2] = syms[l2][c[2]].freq * (R[2]>>TF_SHIFT);
	R[3] = syms[l3][c[3]].freq * (R[3]>>TF_SHIFT);

	R[0] += m[0] - syms[l0][c[0]].start;
	R[1] += m[1] - syms[l1][c[1]].start;
	R[2] += m[2] - syms[l2][c[2]].start;
	R[3] += m[3] - syms[l3][c[3]].start;

	RansDecRenorm(&R[0], &ptr);
	RansDecRenorm(&R[1], &ptr);
	RansDecRenorm(&R[2], &ptr);
	RansDecRenorm(&R[3], &ptr);

	l0 = c[0];
	l1 = c[1];
	l2 = c[2];
	l3 = c[3];
    }

    rans0 = R[0];
    rans1 = R[1];
    rans2 = R[2];
    rans3 = R[3];

    // Remainder
    for (; i4[3] < out_sz; i4[3]++) {
	unsigned char c3 = D[l3].R[RansDecGet(&rans3, TF_SHIFT)];
	out_buf[i4[3]] = c3;
	RansDecAdvanceSymbol(&rans3, &ptr, &syms[l3][c3], TF_SHIFT);
	l3 = c3;
    }

    *out_size = out_sz;

    for (i = 0; i < 256; i++)
	if (D[i].R) free(D[i].R);

    return (unsigned char *)out_buf;
}